

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

string * __thiscall
JetHead::Path::fileBasename_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  string f;
  string local_30;
  
  filename_abi_cxx11_(&local_30,this);
  std::__cxx11::string::rfind((char *)&local_30,0x124b69,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Path::fileBasename()
{
	string f = filename();
	unsigned pos = f.rfind( "." );

	if ( pos == string::npos )
	{
		return f;
	}
	else
	{
		return f.substr( 0, pos );
	}
}